

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseNode(Parser *this)

{
  bool bVar1;
  uint32_t uVar2;
  Module *pMVar3;
  ClockMultiplier *pCVar4;
  Value local_138;
  undefined1 local_f8 [8];
  CodeLocation errorPos_1;
  Value local_e0;
  undefined1 local_a0 [8];
  CodeLocation errorPos;
  string local_78;
  char *local_58;
  pool_ref<soul::heart::ProcessorInstance> local_50 [3];
  ProcessorInstance *local_38;
  ProcessorInstance *mi;
  string name;
  Parser *this_local;
  
  name.field_2._8_8_ = this;
  readQualifiedGeneralIdentifier_abi_cxx11_((string *)&mi,this);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  local_38 = Module::allocate<soul::heart::ProcessorInstance,soul::CodeLocation&>
                       (pMVar3,&(this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                                ).location);
  pMVar3 = pool_ptr<soul::Module>::operator->(&this->module);
  pool_ref<soul::heart::ProcessorInstance>::pool_ref<soul::heart::ProcessorInstance,void>
            (local_50,local_38);
  std::
  vector<soul::pool_ref<soul::heart::ProcessorInstance>,_std::allocator<soul::pool_ref<soul::heart::ProcessorInstance>_>_>
  ::push_back(&pMVar3->processorInstances,local_50);
  pool_ref<soul::heart::ProcessorInstance>::~pool_ref(local_50);
  std::__cxx11::string::operator=((string *)&local_38->instanceName,(string *)&mi);
  local_58 = "=";
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x4aecb7);
  readQualifiedGeneralIdentifier_abi_cxx11_(&local_78,this);
  std::__cxx11::string::operator=((string *)&local_38->sourceName,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d443d);
  if (bVar1) {
    uVar2 = parseProcessorArraySize(this);
    local_38->arraySize = uVar2;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x4d398a);
  }
  errorPos.location.data = "*";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x4d504c);
  if (bVar1) {
    CodeLocation::CodeLocation
              ((CodeLocation *)local_a0,
               &(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ).location);
    pCVar4 = &local_38->clockMultiplier;
    parseInt32Value(&local_e0,this);
    ClockMultiplier::setMultiplier<soul::CodeLocation&>(pCVar4,(CodeLocation *)local_a0,&local_e0);
    soul::Value::~Value(&local_e0);
    CodeLocation::~CodeLocation((CodeLocation *)local_a0);
  }
  else {
    errorPos_1.location.data = "/";
    bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIf<soul::TokenType>
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,(TokenType)0x4ae2e3);
    if (bVar1) {
      CodeLocation::CodeLocation
                ((CodeLocation *)local_f8,
                 &(this->
                  super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ).location);
      pCVar4 = &local_38->clockMultiplier;
      parseInt32Value(&local_138,this);
      ClockMultiplier::setDivider<soul::CodeLocation&>(pCVar4,(CodeLocation *)local_f8,&local_138);
      soul::Value::~Value(&local_138);
      CodeLocation::~CodeLocation((CodeLocation *)local_f8);
    }
  }
  expectSemicolon(this);
  std::__cxx11::string::~string((string *)&mi);
  return;
}

Assistant:

void parseNode()
    {
        auto name = readQualifiedGeneralIdentifier();

        auto& mi = module->allocate<heart::ProcessorInstance> (location);
        module->processorInstances.push_back (mi);
        mi.instanceName = name;
        expect (HEARTOperator::assign);
        mi.sourceName = readQualifiedGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            mi.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        if (matchIf (HEARTOperator::times))
        {
            auto errorPos = location;
            mi.clockMultiplier.setMultiplier (errorPos, parseInt32Value());
        }
        else if (matchIf (HEARTOperator::divide))
        {
            auto errorPos = location;
            mi.clockMultiplier.setDivider (errorPos, parseInt32Value());
        }

        expectSemicolon();
    }